

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

bcf_hrec_t * bcf_hrec_dup(bcf_hrec_t *hrec)

{
  int iVar1;
  char **ppcVar2;
  int iVar3;
  bcf_hrec_t *pbVar4;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  
  pbVar4 = (bcf_hrec_t *)calloc(1,0x30);
  pbVar4->type = hrec->type;
  if (hrec->key != (char *)0x0) {
    pcVar5 = strdup(hrec->key);
    pbVar4->key = pcVar5;
  }
  if (hrec->value != (char *)0x0) {
    pcVar5 = strdup(hrec->value);
    pbVar4->value = pcVar5;
  }
  iVar1 = hrec->nkeys;
  lVar8 = (long)iVar1;
  pbVar4->nkeys = iVar1;
  ppcVar6 = (char **)malloc(lVar8 * 8);
  pbVar4->keys = ppcVar6;
  ppcVar7 = (char **)malloc(lVar8 * 8);
  pbVar4->vals = ppcVar7;
  if (lVar8 < 1) {
    lVar10 = 0;
    iVar9 = 0;
  }
  else {
    ppcVar2 = hrec->keys;
    lVar10 = 0;
    iVar9 = 0;
    do {
      pcVar5 = ppcVar2[lVar10];
      if (pcVar5 == (char *)0x0) {
LAB_00113e42:
        if (hrec->vals[lVar10] != (char *)0x0) {
          pcVar5 = strdup(hrec->vals[lVar10]);
          ppcVar7[iVar9] = pcVar5;
        }
        iVar9 = iVar9 + 1;
      }
      else {
        iVar3 = strcmp("IDX",pcVar5);
        if (iVar3 != 0) {
          if (pcVar5 != (char *)0x0) {
            pcVar5 = strdup(pcVar5);
            ppcVar6[iVar9] = pcVar5;
          }
          goto LAB_00113e42;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar8 != lVar10);
  }
  if ((int)lVar10 != iVar9) {
    pbVar4->nkeys = (iVar1 - (int)lVar10) + iVar9;
  }
  return pbVar4;
}

Assistant:

bcf_hrec_t *bcf_hrec_dup(bcf_hrec_t *hrec)
{
    bcf_hrec_t *out = (bcf_hrec_t*) calloc(1,sizeof(bcf_hrec_t));
    out->type = hrec->type;
    if ( hrec->key ) out->key = strdup(hrec->key);
    if ( hrec->value ) out->value = strdup(hrec->value);
    out->nkeys = hrec->nkeys;
    out->keys = (char**) malloc(sizeof(char*)*hrec->nkeys);
    out->vals = (char**) malloc(sizeof(char*)*hrec->nkeys);
    int i, j = 0;
    for (i=0; i<hrec->nkeys; i++)
    {
        if ( hrec->keys[i] && !strcmp("IDX",hrec->keys[i]) ) continue;
        if ( hrec->keys[i] ) out->keys[j] = strdup(hrec->keys[i]);
        if ( hrec->vals[i] ) out->vals[j] = strdup(hrec->vals[i]);
        j++;
    }
    if ( i!=j ) out->nkeys -= i-j;   // IDX was omitted
    return out;
}